

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O1

bool __thiscall
irr::scene::CB3DMeshFileLoader::readChunkBONE(CB3DMeshFileLoader *this,SJoint *inJoint)

{
  undefined1 *puVar1;
  int iVar2;
  long lVar3;
  pointer piVar4;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined2 *puVar8;
  ulong uVar9;
  void *__src;
  uint uVar10;
  uint uVar11;
  double __x;
  double __x_00;
  u32 globalVertexID;
  f32 strength;
  uint local_40;
  float local_3c;
  SJoint *local_38;
  
  local_38 = inJoint;
  if (*(int *)(*(long *)&(this->super_IMeshLoader).field_0x10 + -0xc) < 9) {
LAB_001b2177:
    lVar3 = *(long *)&(this->super_IMeshLoader).field_0x8;
    pvVar5 = *(void **)&(this->super_IMeshLoader).field_0x10;
    uVar9 = (long)pvVar5 + (0xffffffff0 - lVar3) & 0xffffffff0;
    __src = (void *)(lVar3 + uVar9 + 0x10);
    if (__src != pvVar5) {
      memmove((void *)(lVar3 + uVar9),__src,(long)pvVar5 - (long)__src);
    }
    puVar1 = &(this->super_IMeshLoader).field_0x10;
    *(long *)puVar1 = *(long *)puVar1 + -0x10;
    bVar6 = true;
  }
  else {
    do {
      lVar3 = *(long *)&(this->super_IMeshLoader).field_0x10;
      iVar2 = *(int *)(lVar3 + -0xc);
      lVar3 = *(long *)(lVar3 + -8);
      iVar7 = (*this->B3DFile->_vptr_IReadFile[3])();
      if (iVar2 + lVar3 <= CONCAT44(extraout_var,iVar7)) goto LAB_001b2177;
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_40,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_3c,4);
      uVar10 = local_40 + this->VerticesStart;
      piVar4 = (this->AnimatedVertices_VertexID).m_data.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar11 = (uint)((ulong)((long)(this->AnimatedVertices_VertexID).m_data.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar4) >> 2);
      local_40 = uVar10;
      if (uVar10 < uVar11) {
        if (piVar4[uVar10] == -1) {
          os::Printer::log((Printer *)
                           "B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)"
                           ,__x);
        }
        else if (0.0 < local_3c) {
          puVar8 = (undefined2 *)
                   (**(code **)(*(long *)this->AnimatedMesh + 0x100))(this->AnimatedMesh,local_38);
          *(float *)(puVar8 + 4) = local_3c;
          *(int *)(puVar8 + 2) =
               (this->AnimatedVertices_VertexID).m_data.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[local_40];
          *puVar8 = (short)(this->AnimatedVertices_BufferID).m_data.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[local_40];
        }
      }
      else {
        (*this->B3DFile->_vptr_IReadFile[4])();
        os::Printer::log(__x_00);
      }
    } while (uVar10 < uVar11);
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool CB3DMeshFileLoader::readChunkBONE(CSkinnedMesh::SJoint *inJoint)
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBONE";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	if (B3dStack.getLast().length > 8) {
		while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
		{
			u32 globalVertexID;
			f32 strength;
			B3DFile->read(&globalVertexID, sizeof(globalVertexID));
			B3DFile->read(&strength, sizeof(strength));
#ifdef __BIG_ENDIAN__
			globalVertexID = os::Byteswap::byteswap(globalVertexID);
			strength = os::Byteswap::byteswap(strength);
#endif
			globalVertexID += VerticesStart;

			if (globalVertexID >= AnimatedVertices_VertexID.size()) {
				os::Printer::log("Illegal vertex index found", B3DFile->getFileName(), ELL_ERROR);
				return false;
			}

			if (AnimatedVertices_VertexID[globalVertexID] == -1) {
				os::Printer::log("B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)");
			} else if (strength > 0) {
				CSkinnedMesh::SWeight *weight = AnimatedMesh->addWeight(inJoint);
				weight->strength = strength;
				// Find the meshbuffer and Vertex index from the Global Vertex ID:
				weight->vertex_id = AnimatedVertices_VertexID[globalVertexID];
				weight->buffer_id = AnimatedVertices_BufferID[globalVertexID];
			}
		}
	}

	B3dStack.erase(B3dStack.size() - 1);
	return true;
}